

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeViewPrivate::lastVisibleItem(QTreeViewPrivate *this,int firstVisual,int offset)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  int offset_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  offset_local = offset;
  if (((offset | firstVisual) < 0) &&
     (firstVisual = firstVisibleItem(this,&offset_local), firstVisual < 0)) {
    iVar6 = -1;
  }
  else {
    pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar1 = (pQVar3->crect).y2.m_i;
    iVar2 = (pQVar3->crect).y1.m_i;
    iVar7 = -offset_local;
    uVar8 = (ulong)(uint)firstVisual;
    iVar6 = firstVisual - 1;
    do {
      uVar4 = (this->viewItems).d.size;
      if (uVar4 <= uVar8) {
        iVar6 = (int)uVar4 + -1;
        break;
      }
      iVar5 = itemHeight(this,(int)uVar8);
      iVar7 = iVar7 + iVar5;
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + 1;
    } while (iVar7 <= (iVar1 - iVar2) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QTreeViewPrivate::lastVisibleItem(int firstVisual, int offset) const
{
    if (firstVisual < 0 || offset < 0) {
        firstVisual = firstVisibleItem(&offset);
        if (firstVisual < 0)
            return -1;
    }
    int y = - offset;
    int value = viewport->height();

    for (int i = firstVisual; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value)
            return i;
    }
    return viewItems.size() - 1;
}